

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusRcFactor::emulate_mthd(MthdCelsiusRcFactor *this)

{
  pgraph_state *state;
  uint32_t val;
  int iVar1;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    val = (this->super_SingleMthdTest).super_MthdTest.val;
    iVar1 = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_factor_0
    [(ulong)(iVar1 != 0) * 8] = val;
    pgraph_celsius_icmd(state,iVar1 + 0x14,val,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		if (!extr(exp.nsource, 1, 1)) {
			if (idx == 0)
				exp.bundle_rc_factor_0[0] = val;
			else
				exp.bundle_rc_factor_1[0] = val;
			pgraph_celsius_icmd(&exp, 0x14 + idx, val, true);
		}
	}